

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O3

void client_map(natwm_state *state,client *client,monitor *monitor)

{
  client_state cVar1;
  uint uVar2;
  theme *ptVar3;
  uint32_t border_width;
  border_theme *pbVar4;
  xcb_rectangle_t rect;
  xcb_window_t window;
  xcb_connection_t *connection;
  
  if (client != (client *)0x0) {
    if (client->is_fullscreen == false) {
      ptVar3 = state->workspace_list->theme;
      cVar1 = client->state;
      if ((cVar1 & CLIENT_URGENT) == 0) {
        if ((cVar1 & CLIENT_STICKY) == 0) {
          if ((cVar1 & CLIENT_OFF_SCREEN) == 0) {
            pbVar4 = (border_theme *)
                     ((long)&ptVar3->border_width->unfocused + (ulong)((uint)client->is_focused * 2)
                     );
          }
          else {
            pbVar4 = ptVar3->border_width;
          }
        }
        else {
          pbVar4 = (border_theme *)&ptVar3->border_width->sticky;
        }
      }
      else {
        pbVar4 = (border_theme *)&ptVar3->border_width->urgent;
      }
      border_width = (uint32_t)pbVar4->unfocused;
      window = client->window;
      uVar2._0_2_ = (client->rect).width;
      uVar2._2_2_ = (client->rect).height;
      connection = state->xcb;
      rect = (xcb_rectangle_t)
             ((ulong)(ushort)((monitor->rect).x + (client->rect).x) |
             (ulong)(ushort)((monitor->rect).y + (client->rect).y) << 0x10 | (ulong)uVar2 << 0x20);
    }
    else {
      connection = state->xcb;
      window = client->window;
      rect = monitor->rect;
      border_width = 0;
    }
    client_configure_window_rect(connection,window,rect,border_width);
    if ((client->state & CLIENT_HIDDEN) != 0) {
      client->state = client->state & 0xfb;
    }
    xcb_map_window(state->xcb,client->window);
    return;
  }
  return;
}

Assistant:

void client_map(const struct natwm_state *state, struct client *client,
                const struct monitor *monitor)
{
        if (client == NULL) {
                // Skip this client
                return;
        }

        struct theme *theme = state->workspace_list->theme;
        uint32_t border_width = client_get_active_border_width(theme, client);

        if (client->is_fullscreen) {
                client_configure_window_rect(
                        state->xcb, client->window, monitor->rect, border_width);
        } else {
                xcb_rectangle_t new_rect = {
                        (int16_t)(client->rect.x + monitor->rect.x),
                        (int16_t)(client->rect.y + monitor->rect.y),
                        client->rect.width,
                        client->rect.height,
                };

                client_configure_window_rect(state->xcb, client->window, new_rect, border_width);
        }

        if (client->state & CLIENT_HIDDEN) {
                client->state &= (uint8_t)~CLIENT_HIDDEN;
        }

        xcb_map_window(state->xcb, client->window);
}